

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_13::NameResolver::VisitModule(NameResolver *this,Module *module)

{
  ExprVisitor *this_00;
  Func *func;
  pointer ppEVar1;
  Export *pEVar2;
  pointer ppGVar3;
  ElemSegment *pEVar4;
  pointer pVVar5;
  pointer ppDVar6;
  DataSegment *pDVar7;
  pointer ppVVar8;
  Var *var;
  pointer ppEVar9;
  pointer var_00;
  pointer ppFVar10;
  pointer ppGVar11;
  pointer ppEVar12;
  pointer ppDVar13;
  pointer ppVVar14;
  _Any_data local_60;
  code *local_50;
  code *local_48;
  pointer local_40;
  Module *local_38;
  
  this->current_module_ = module;
  CheckDuplicateBindings(this,&module->func_bindings,"function");
  CheckDuplicateBindings(this,&module->global_bindings,"global");
  CheckDuplicateBindings(this,&module->func_type_bindings,"function type");
  CheckDuplicateBindings(this,&module->table_bindings,"table");
  CheckDuplicateBindings(this,&module->memory_bindings,"memory");
  CheckDuplicateBindings(this,&module->except_bindings,"except");
  local_40 = (module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl
             .super__Vector_impl_data._M_finish;
  this_00 = &this->visitor_;
  local_38 = module;
  for (ppFVar10 = (module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppFVar10 != local_40;
      ppFVar10 = ppFVar10 + 1) {
    func = *ppFVar10;
    this->current_func_ = func;
    if ((func->decl).has_func_type == true) {
      ResolveFuncTypeVar(this,&(func->decl).type_var);
    }
    local_48 = std::
               _Function_handler<void_(const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/resolve-names.cc:383:7)>
               ::_M_invoke;
    local_50 = std::
               _Function_handler<void_(const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/resolve-names.cc:383:7)>
               ::_M_manager;
    local_60._M_unused._0_8_ = (undefined8)func;
    local_60._8_8_ = this;
    BindingHash::FindDuplicates(&func->bindings,(DuplicateCallback *)&local_60);
    std::_Function_base::~_Function_base((_Function_base *)&local_60);
    ExprVisitor::VisitFunc(this_00,func);
    this->current_func_ = (Func *)0x0;
  }
  ppEVar1 = (local_38->exports).super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppEVar9 = (local_38->exports).
                 super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppEVar9 != ppEVar1; ppEVar9 = ppEVar9 + 1) {
    pEVar2 = *ppEVar9;
    switch(pEVar2->kind) {
    case First:
      ResolveFuncVar(this,&pEVar2->var);
      break;
    case Table:
      ResolveTableVar(this,&pEVar2->var);
      break;
    case Memory:
      ResolveMemoryVar(this,&pEVar2->var);
      break;
    case Global:
      ResolveGlobalVar(this,&pEVar2->var);
      break;
    case Except:
      ResolveExceptionVar(this,&pEVar2->var);
    }
  }
  ppGVar3 = (local_38->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppGVar11 = (local_38->globals).
                  super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppGVar11 != ppGVar3; ppGVar11 = ppGVar11 + 1) {
    ExprVisitor::VisitExprList(this_00,&(*ppGVar11)->init_expr);
  }
  local_40 = (pointer)(local_38->elem_segments).
                      super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
  for (ppEVar12 = (local_38->elem_segments).
                  super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; (pointer)ppEVar12 != local_40;
      ppEVar12 = ppEVar12 + 1) {
    pEVar4 = *ppEVar12;
    ResolveTableVar(this,&pEVar4->table_var);
    ExprVisitor::VisitExprList(this_00,&pEVar4->offset);
    pVVar5 = (pEVar4->vars).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (var_00 = (pEVar4->vars).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>._M_impl.
                  super__Vector_impl_data._M_start; var_00 != pVVar5; var_00 = var_00 + 1) {
      ResolveFuncVar(this,var_00);
    }
  }
  ppDVar6 = (local_38->data_segments).
            super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppDVar13 = (local_38->data_segments).
                  super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppDVar13 != ppDVar6;
      ppDVar13 = ppDVar13 + 1) {
    pDVar7 = *ppDVar13;
    ResolveMemoryVar(this,&pDVar7->memory_var);
    ExprVisitor::VisitExprList(this_00,&pDVar7->offset);
  }
  ppVVar8 = (local_38->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  for (ppVVar14 = (local_38->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppVVar14 != ppVVar8;
      ppVVar14 = ppVVar14 + 1) {
    ResolveFuncVar(this,*ppVVar14);
  }
  this->current_module_ = (Module *)0x0;
  return (Result)(this->result_).enum_;
}

Assistant:

Result NameResolver::VisitModule(Module* module) {
  current_module_ = module;
  CheckDuplicateBindings(&module->func_bindings, "function");
  CheckDuplicateBindings(&module->global_bindings, "global");
  CheckDuplicateBindings(&module->func_type_bindings, "function type");
  CheckDuplicateBindings(&module->table_bindings, "table");
  CheckDuplicateBindings(&module->memory_bindings, "memory");
  CheckDuplicateBindings(&module->except_bindings, "except");

  for (Func* func : module->funcs)
    VisitFunc(func);
  for (Export* export_ : module->exports)
    VisitExport(export_);
  for (Global* global : module->globals)
    VisitGlobal(global);
  for (ElemSegment* elem_segment : module->elem_segments)
    VisitElemSegment(elem_segment);
  for (DataSegment* data_segment : module->data_segments)
    VisitDataSegment(data_segment);
  for (Var* start : module->starts)
    ResolveFuncVar(start);
  current_module_ = nullptr;
  return result_;
}